

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

void __thiscall
duckdb::TemporaryFileCompressionAdaptivity::Update
          (TemporaryFileCompressionAdaptivity *this,TemporaryCompressionLevel level,
          int64_t time_before_ns)

{
  long lVar1;
  idx_t iVar2;
  int64_t *piVar3;
  
  lVar1 = ::std::chrono::_V2::system_clock::now();
  if (level == UNCOMPRESSED) {
    piVar3 = &this->last_uncompressed_write_ns;
  }
  else {
    iVar2 = LevelToIndex(level);
    piVar3 = this->last_compressed_writes_ns + iVar2;
  }
  ::std::mutex::lock((mutex *)this);
  *piVar3 = (*piVar3 * 0xf + (lVar1 - time_before_ns)) / 0x10;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void TemporaryFileCompressionAdaptivity::Update(const TemporaryCompressionLevel level, const int64_t time_before_ns) {
	const auto duration = GetCurrentTimeNanos() - time_before_ns;
	auto &last_write_ns = level == TemporaryCompressionLevel::UNCOMPRESSED
	                          ? last_uncompressed_write_ns
	                          : last_compressed_writes_ns[LevelToIndex(level)];
	lock_guard<mutex> guard(random_engine.lock);
	last_write_ns = (last_write_ns * (WEIGHT - 1) + duration) / WEIGHT;
}